

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzer.cpp
# Opt level: O0

void __thiscall USBAnalyzer::USBAnalyzer(USBAnalyzer *this)

{
  USBAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__USBAnalyzer_0018e140;
  std::
  map<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler,_std::less<USBAnalyzer::USBPipe>,_std::allocator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>_>
  ::map(&this->mCtrlTransPacketHandlers);
  USBPipe::USBPipe(&this->mCtrlTransLastPipe);
  USBAnalyzerSettings::USBAnalyzerSettings(&this->mSettings);
  std::auto_ptr<USBAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  USBSimulationDataGenerator::USBSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

USBAnalyzer::USBAnalyzer() : mSimulationInitilized( false )
{
    SetAnalyzerSettings( &mSettings );
}